

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCLoader.cpp
# Opt level: O0

void __thiscall
Assimp::IFCImporter::InternReadFile
          (IFCImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  double *this_00;
  pointer *this_01;
  aiNode *paVar1;
  bool bVar2;
  int iVar3;
  IOStream *__p;
  undefined8 uVar4;
  char *num_bytes;
  MemoryIOStream *this_02;
  DB *__p_00;
  type pDVar5;
  long lVar6;
  pointer pDVar7;
  LazyObject *pLVar8;
  IfcProject *proj_00;
  size_type sVar9;
  aiMesh **__s;
  iterator __first;
  iterator __last;
  aiMaterial **__s_00;
  iterator __first_00;
  iterator __last_00;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar10;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *message;
  ulong uVar11;
  aiVector3t<float> aVar12;
  bool local_f39;
  int local_ee8;
  uint64_t local_e70;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_e68;
  aiMatrix4x4t<float> local_cf0;
  aiMatrix4x4t<float> local_cb0;
  aiMatrix4x4t<float> local_c70;
  aiMatrix4x4t<float> local_c30;
  aiVector3t<float> local_bf0;
  aiVector3t<double> local_be0;
  aiVector3t<float> local_bc8;
  undefined1 local_bb8 [8];
  aiMatrix4x4 rot;
  aiMatrix4x4 scale;
  undefined1 local_b18 [8];
  ConversionData conv;
  string local_988;
  allocator<char> local_961;
  string local_960;
  LazyObject *local_940;
  LazyObject *proj;
  ConversionSchema schema;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8e8;
  format local_8c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_750;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_730;
  format local_710;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_598;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_578;
  format local_558;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  byte local_3b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  HeaderInfo *local_398;
  HeaderInfo *head;
  unique_ptr<Assimp::STEP::DB,_std::default_delete<Assimp::STEP::DB>_> local_380;
  unique_ptr<Assimp::STEP::DB,_std::default_delete<Assimp::STEP::DB>_> db;
  string local_370;
  allocator<char> local_349;
  string local_348;
  uLong local_328;
  size_t filesize;
  void *buffer;
  int bufferSize;
  int read;
  size_t total;
  uint8_t *buff;
  string local_2f8;
  string local_2d8;
  char local_2b8 [8];
  char filename [256];
  unz_file_info fileInfo;
  long local_110;
  size_type s;
  string fileName;
  string local_e0;
  long local_c0;
  unzFile zip;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_59;
  string local_58;
  undefined1 local_38 [8];
  shared_ptr<Assimp::IOStream> stream;
  IOSystem *pIOHandler_local;
  aiScene *pScene_local;
  string *pFile_local;
  IFCImporter *this_local;
  
  stream.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pIOHandler;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"rb",&local_59);
  __p = IOSystem::Open(pIOHandler,pFile,&local_58);
  std::shared_ptr<Assimp::IOStream>::shared_ptr<Assimp::IOStream,void>
            ((shared_ptr<Assimp::IOStream> *)local_38,__p);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_38);
  if (!bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"Could not open file for reading",&local_91);
    LogFunctions<Assimp::IFCImporter>::ThrowException(&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator(&local_91);
  }
  BaseImporter::GetExtension((string *)&zip,pFile);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&zip,
                          "ifczip");
  std::__cxx11::string::~string((string *)&zip);
  if (bVar2) {
    uVar4 = std::__cxx11::string::c_str();
    local_c0 = unzOpen(uVar4);
    if (local_c0 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e0,"Could not open ifczip file for reading, unzip failed",
                 (allocator<char> *)(fileName.field_2._M_local_buf + 0xf));
      LogFunctions<Assimp::IFCImporter>::ThrowException(&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::allocator<char>::~allocator((allocator<char> *)(fileName.field_2._M_local_buf + 0xf));
    }
    std::__cxx11::string::length();
    std::__cxx11::string::substr((ulong)&s,(ulong)pFile);
    local_110 = std::__cxx11::string::find_last_of((char)pFile,0x5c);
    if (local_110 == -1) {
      local_110 = std::__cxx11::string::find_last_of((char)pFile,0x2f);
    }
    if (local_110 != -1) {
      std::__cxx11::string::substr((ulong)&fileInfo.tmu_date.tm_mon,(ulong)&s);
      std::__cxx11::string::operator=((string *)&s,(string *)&fileInfo.tmu_date.tm_mon);
      std::__cxx11::string::~string((string *)&fileInfo.tmu_date.tm_mon);
    }
    iVar3 = unzGoToFirstFile(local_c0);
    if (iVar3 == 0) {
      do {
        unzGetCurrentFileInfo(local_c0,filename + 0xf8,local_2b8,0x100,0,0,0,0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2f8,local_2b8,(allocator<char> *)((long)&buff + 7));
        BaseImporter::GetExtension(&local_2d8,&local_2f8);
        bVar2 = std::operator!=(&local_2d8,"ifc");
        std::__cxx11::string::~string((string *)&local_2d8);
        std::__cxx11::string::~string((string *)&local_2f8);
        std::allocator<char>::~allocator((allocator<char> *)((long)&buff + 7));
      } while (bVar2);
      total = (size_t)operator_new__(fileInfo.compressed_size);
      LogFunctions<Assimp::IFCImporter>::LogInfo("Decompressing IFCZIP file");
      unzOpenCurrentFile(local_c0);
      _bufferSize = 0;
      buffer._4_4_ = 0;
      do {
        if (fileInfo.compressed_size < 0x7fff) {
          local_ee8 = (int)fileInfo.compressed_size;
        }
        else {
          local_ee8 = 0x7fff;
        }
        buffer._0_4_ = local_ee8;
        num_bytes = (char *)malloc((long)local_ee8);
        filesize = (size_t)num_bytes;
        buffer._4_4_ = unzReadCurrentFile(local_c0,num_bytes,(int)buffer);
        if (0 < buffer._4_4_) {
          num_bytes = (char *)filesize;
          memcpy((void *)(total + _bufferSize),(void *)filesize,(long)buffer._4_4_);
          _bufferSize = (long)buffer._4_4_ + _bufferSize;
        }
        free((void *)filesize);
      } while (0 < buffer._4_4_);
      local_328 = fileInfo.compressed_size;
      if ((_bufferSize == 0) || (_bufferSize != fileInfo.compressed_size)) {
        if (total != 0) {
          operator_delete__((void *)total);
        }
        std::allocator<char>::allocator();
        num_bytes = "Failed to decompress IFC ZIP file";
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_348,"Failed to decompress IFC ZIP file",&local_349);
        LogFunctions<Assimp::IFCImporter>::ThrowException(&local_348);
        std::__cxx11::string::~string((string *)&local_348);
        std::allocator<char>::~allocator(&local_349);
      }
      unzCloseCurrentFile(local_c0);
      this_02 = (MemoryIOStream *)
                Intern::AllocateFromAssimpHeap::operator_new
                          ((AllocateFromAssimpHeap *)0x28,(size_t)num_bytes);
      MemoryIOStream::MemoryIOStream(this_02,(uint8_t *)total,fileInfo.compressed_size,true);
      std::__shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>::reset<Assimp::MemoryIOStream>
                ((__shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2> *)local_38,this_02);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_370,"Found no IFC file member in IFCZIP file (2)",
                 (allocator<char> *)
                 ((long)&db._M_t.
                         super___uniq_ptr_impl<Assimp::STEP::DB,_std::default_delete<Assimp::STEP::DB>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Assimp::STEP::DB_*,_std::default_delete<Assimp::STEP::DB>_>
                         .super__Head_base<0UL,_Assimp::STEP::DB_*,_false>._M_head_impl + 7));
      LogFunctions<Assimp::IFCImporter>::ThrowException(&local_370);
      std::__cxx11::string::~string((string *)&local_370);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&db._M_t.
                         super___uniq_ptr_impl<Assimp::STEP::DB,_std::default_delete<Assimp::STEP::DB>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Assimp::STEP::DB_*,_std::default_delete<Assimp::STEP::DB>_>
                         .super__Head_base<0UL,_Assimp::STEP::DB_*,_false>._M_head_impl + 7));
    }
    unzClose(local_c0);
    std::__cxx11::string::~string((string *)&s);
  }
  std::shared_ptr<Assimp::IOStream>::shared_ptr
            ((shared_ptr<Assimp::IOStream> *)&head,(shared_ptr<Assimp::IOStream> *)local_38);
  __p_00 = STEP::ReadFileHeader((shared_ptr<Assimp::IOStream> *)&head);
  std::unique_ptr<Assimp::STEP::DB,std::default_delete<Assimp::STEP::DB>>::
  unique_ptr<std::default_delete<Assimp::STEP::DB>,void>
            ((unique_ptr<Assimp::STEP::DB,std::default_delete<Assimp::STEP::DB>> *)&local_380,__p_00
            );
  std::shared_ptr<Assimp::IOStream>::~shared_ptr((shared_ptr<Assimp::IOStream> *)&head);
  pDVar5 = std::unique_ptr<Assimp::STEP::DB,_std::default_delete<Assimp::STEP::DB>_>::operator*
                     (&local_380);
  local_398 = STEP::DB::GetHeader(pDVar5);
  lVar6 = std::__cxx11::string::size();
  local_3b9 = 0;
  local_f39 = true;
  if (lVar6 != 0) {
    std::__cxx11::string::substr((ulong)&local_3b8,(ulong)&local_398->fileSchema);
    local_3b9 = 1;
    local_f39 = std::operator!=(&local_3b8,"IFC");
  }
  if ((local_3b9 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_3b8);
  }
  if (local_f39 != false) {
    std::operator+(&local_3e0,"Unrecognized file schema: ",&local_398->fileSchema);
    LogFunctions<Assimp::IFCImporter>::ThrowException(&local_3e0);
    std::__cxx11::string::~string((string *)&local_3e0);
  }
  bVar2 = DefaultLogger::isNullLogger();
  if (!bVar2) {
    std::operator+(&local_598,"File schema is \'",&local_398->fileSchema);
    std::operator+(&local_578,&local_598,'\'');
    Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
    basic_formatter<std::__cxx11::string>
              ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)&local_558,
               &local_578);
    LogFunctions<Assimp::IFCImporter>::LogDebug(&local_558);
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    ~basic_formatter(&local_558);
    std::__cxx11::string::~string((string *)&local_578);
    std::__cxx11::string::~string((string *)&local_598);
    lVar6 = std::__cxx11::string::length();
    if (lVar6 != 0) {
      std::operator+(&local_750,"Timestamp \'",&local_398->timestamp);
      std::operator+(&local_730,&local_750,'\'');
      Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
      basic_formatter<std::__cxx11::string>
                ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)&local_710,
                 &local_730);
      LogFunctions<Assimp::IFCImporter>::LogDebug(&local_710);
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      ~basic_formatter(&local_710);
      std::__cxx11::string::~string((string *)&local_730);
      std::__cxx11::string::~string((string *)&local_750);
    }
    lVar6 = std::__cxx11::string::length();
    if (lVar6 != 0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &schema.converters._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     "Application/Exporter identline is \'",&local_398->app);
      std::operator+(&local_8e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &schema.converters._M_t._M_impl.super__Rb_tree_header._M_node_count,'\'');
      Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
      basic_formatter<std::__cxx11::string>
                ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)&local_8c8,
                 &local_8e8);
      LogFunctions<Assimp::IFCImporter>::LogDebug(&local_8c8);
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      ~basic_formatter(&local_8c8);
      std::__cxx11::string::~string((string *)&local_8e8);
      std::__cxx11::string::~string
                ((string *)&schema.converters._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
  }
  STEP::EXPRESS::ConversionSchema::ConversionSchema((ConversionSchema *)&proj);
  Assimp::IFC::Schema_2x3::GetSchema((ConversionSchema *)&proj);
  pDVar5 = std::unique_ptr<Assimp::STEP::DB,_std::default_delete<Assimp::STEP::DB>_>::operator*
                     (&local_380);
  STEP::ReadFile<3ul,6ul>
            (pDVar5,(ConversionSchema *)&proj,&InternReadFile::types_to_track,
             &InternReadFile::inverse_indices_to_track);
  pDVar7 = std::unique_ptr<Assimp::STEP::DB,_std::default_delete<Assimp::STEP::DB>_>::operator->
                     (&local_380);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_960,"ifcproject",&local_961);
  pLVar8 = STEP::DB::GetObject(pDVar7,&local_960);
  std::__cxx11::string::~string((string *)&local_960);
  std::allocator<char>::~allocator(&local_961);
  local_940 = pLVar8;
  if (pLVar8 == (LazyObject *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_988,"missing IfcProject entity",
               (allocator<char> *)
               ((long)&conv.already_processed._M_t._M_impl.super__Rb_tree_header._M_node_count + 7))
    ;
    LogFunctions<Assimp::IFCImporter>::ThrowException(&local_988);
    std::__cxx11::string::~string((string *)&local_988);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&conv.already_processed._M_t._M_impl.super__Rb_tree_header._M_node_count + 7))
    ;
  }
  pDVar5 = std::unique_ptr<Assimp::STEP::DB,_std::default_delete<Assimp::STEP::DB>_>::operator*
                     (&local_380);
  proj_00 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcProject>(local_940);
  Assimp::IFC::ConversionData::ConversionData
            ((ConversionData *)local_b18,pDVar5,proj_00,pScene,&this->settings);
  anon_unknown.dwarf_9bfa9f::SetUnits((ConversionData *)local_b18);
  anon_unknown.dwarf_9bfa9f::SetCoordinateSpace((ConversionData *)local_b18);
  anon_unknown.dwarf_9bfa9f::ProcessSpatialStructures((ConversionData *)local_b18);
  anon_unknown.dwarf_9bfa9f::MakeTreeRelative((ConversionData *)local_b18);
  sVar9 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size
                    ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)&conv.wcs.d4);
  if (sVar9 != 0) {
    sVar9 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size
                      ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)&conv.wcs.d4);
    pScene->mNumMeshes = (uint)sVar9;
    uVar11 = (ulong)pScene->mNumMeshes << 3;
    __s = (aiMesh **)operator_new__(uVar11);
    memset(__s,0,uVar11);
    pScene->mMeshes = __s;
    this_00 = &conv.wcs.d4;
    __first = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::begin
                        ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)this_00);
    __last = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::end
                       ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)this_00);
    std::
    copy<__gnu_cxx::__normal_iterator<aiMesh**,std::vector<aiMesh*,std::allocator<aiMesh*>>>,aiMesh**>
              ((__normal_iterator<aiMesh_**,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>)
               __first._M_current,
               (__normal_iterator<aiMesh_**,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>)
               __last._M_current,pScene->mMeshes);
    std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::clear
              ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)&conv.wcs.d4);
  }
  sVar9 = std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::size
                    ((vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)
                     &conv.meshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  if (sVar9 != 0) {
    sVar9 = std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::size
                      ((vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)
                       &conv.meshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    pScene->mNumMaterials = (uint)sVar9;
    uVar11 = (ulong)pScene->mNumMaterials << 3;
    __s_00 = (aiMaterial **)operator_new__(uVar11);
    memset(__s_00,0,uVar11);
    pScene->mMaterials = __s_00;
    this_01 = &conv.meshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    __first_00 = std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::begin
                           ((vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)this_01);
    __last_00 = std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::end
                          ((vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)this_01);
    std::
    copy<__gnu_cxx::__normal_iterator<aiMaterial**,std::vector<aiMaterial*,std::allocator<aiMaterial*>>>,aiMaterial**>
              ((__normal_iterator<aiMaterial_**,_std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>_>
                )__first_00._M_current,
               (__normal_iterator<aiMaterial_**,_std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>_>
                )__last_00._M_current,pScene->mMaterials);
    std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::clear
              ((vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)
               &conv.meshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  aiMatrix4x4t<float>::aiMatrix4x4t((aiMatrix4x4t<float> *)&rot.d3);
  aiMatrix4x4t<float>::aiMatrix4x4t((aiMatrix4x4t<float> *)local_bb8);
  aiVector3t<double>::aiVector3t(&local_be0,(double)local_b18);
  aVar12 = aiVector3t::operator_cast_to_aiVector3t((aiVector3t *)&local_be0);
  local_bf0.z = aVar12.z;
  local_bf0._0_8_ = aVar12._0_8_;
  local_bc8._0_8_ = local_bf0._0_8_;
  local_bc8.z = local_bf0.z;
  aiMatrix4x4t<float>::Scaling(&local_bc8,(aiMatrix4x4t<float> *)&rot.d3);
  aiMatrix4x4t<float>::RotationX(-1.5707964,(aiMatrix4x4t<float> *)local_bb8);
  aiMatrix4x4t<float>::operator*
            (&local_cb0,(aiMatrix4x4t<float> *)local_bb8,(aiMatrix4x4t<float> *)&rot.d3);
  aiMatrix4x4t::operator_cast_to_aiMatrix4x4t(&local_cf0,(aiMatrix4x4t *)&conv.out);
  aiMatrix4x4t<float>::operator*(&local_c70,&local_cb0,&local_cf0);
  aiMatrix4x4t<float>::operator*(&local_c30,&local_c70,&pScene->mRootNode->mTransformation);
  paVar1 = pScene->mRootNode;
  (paVar1->mTransformation).d1 = local_c30.d1;
  (paVar1->mTransformation).d2 = local_c30.d2;
  (paVar1->mTransformation).d3 = local_c30.d3;
  (paVar1->mTransformation).d4 = local_c30.d4;
  (paVar1->mTransformation).c1 = local_c30.c1;
  (paVar1->mTransformation).c2 = local_c30.c2;
  (paVar1->mTransformation).c3 = local_c30.c3;
  (paVar1->mTransformation).c4 = local_c30.c4;
  (paVar1->mTransformation).b1 = local_c30.b1;
  (paVar1->mTransformation).b2 = local_c30.b2;
  (paVar1->mTransformation).b3 = local_c30.b3;
  (paVar1->mTransformation).b4 = local_c30.b4;
  (paVar1->mTransformation).a1 = local_c30.a1;
  (paVar1->mTransformation).a2 = local_c30.a2;
  (paVar1->mTransformation).a3 = local_c30.a3;
  (paVar1->mTransformation).a4 = local_c30.a4;
  bVar2 = DefaultLogger::isNullLogger();
  if (!bVar2) {
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::basic_formatter
              (&local_e68);
    pbVar10 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
              Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
              operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                        &local_e68,(char (*) [17])"STEP: evaluated ");
    pDVar7 = std::unique_ptr<Assimp::STEP::DB,_std::default_delete<Assimp::STEP::DB>_>::operator->
                       (&local_380);
    local_e70 = STEP::DB::GetEvaluatedObjectCount(pDVar7);
    pbVar10 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
              Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
              operator_(pbVar10,&local_e70);
    message = Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
              operator_(pbVar10,(char (*) [16])" object records");
    LogFunctions<Assimp::IFCImporter>::LogDebug(message);
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    ~basic_formatter(&local_e68);
  }
  Assimp::IFC::ConversionData::~ConversionData((ConversionData *)local_b18);
  STEP::EXPRESS::ConversionSchema::~ConversionSchema((ConversionSchema *)&proj);
  std::unique_ptr<Assimp::STEP::DB,_std::default_delete<Assimp::STEP::DB>_>::~unique_ptr(&local_380)
  ;
  std::shared_ptr<Assimp::IOStream>::~shared_ptr((shared_ptr<Assimp::IOStream> *)local_38);
  return;
}

Assistant:

void IFCImporter::InternReadFile( const std::string& pFile, aiScene* pScene, IOSystem* pIOHandler)
{
    std::shared_ptr<IOStream> stream(pIOHandler->Open(pFile));
    if (!stream) {
        ThrowException("Could not open file for reading");
    }


    // if this is a ifczip file, decompress its contents first
    if(GetExtension(pFile) == "ifczip") {
#ifndef ASSIMP_BUILD_NO_COMPRESSED_IFC
        unzFile zip = unzOpen( pFile.c_str() );
        if(zip == NULL) {
            ThrowException("Could not open ifczip file for reading, unzip failed");
        }

        // chop 'zip' postfix
        std::string fileName = pFile.substr(0,pFile.length() - 3);

        std::string::size_type s = pFile.find_last_of('\\');
        if(s == std::string::npos) {
            s = pFile.find_last_of('/');
        }
        if(s != std::string::npos) {
            fileName = fileName.substr(s+1);
        }

        // search file (same name as the IFCZIP except for the file extension) and place file pointer there
        if(UNZ_OK == unzGoToFirstFile(zip)) {
            do {
                // get file size, etc.
                unz_file_info fileInfo;
                char filename[256];
                unzGetCurrentFileInfo( zip , &fileInfo, filename, sizeof(filename), 0, 0, 0, 0 );
                if (GetExtension(filename) != "ifc") {
                    continue;
                }
                uint8_t* buff = new uint8_t[fileInfo.uncompressed_size];
                LogInfo("Decompressing IFCZIP file");
                unzOpenCurrentFile(zip);
                size_t total = 0;
                int read = 0;
                do {
                    int bufferSize = fileInfo.uncompressed_size < INT16_MAX ? fileInfo.uncompressed_size : INT16_MAX;
                    void* buffer = malloc(bufferSize);
                    read = unzReadCurrentFile(zip, buffer, bufferSize);
                    if (read > 0) {
                        memcpy((char*)buff + total, buffer, read);
                        total += read;
                    }
                    free(buffer);
                } while (read > 0);
                size_t filesize = fileInfo.uncompressed_size;
                if (total == 0 || size_t(total) != filesize)
                {
                    delete[] buff;
                    ThrowException("Failed to decompress IFC ZIP file");
                }
                unzCloseCurrentFile( zip );
                stream.reset(new MemoryIOStream(buff,fileInfo.uncompressed_size,true));
                break;

                if (unzGoToNextFile(zip) == UNZ_END_OF_LIST_OF_FILE) {
                    ThrowException("Found no IFC file member in IFCZIP file (1)");
                }

            } while(true);
        }
        else {
            ThrowException("Found no IFC file member in IFCZIP file (2)");
        }

        unzClose(zip);
#else
        ThrowException("Could not open ifczip file for reading, assimp was built without ifczip support");
#endif
    }

    std::unique_ptr<STEP::DB> db(STEP::ReadFileHeader(stream));
    const STEP::HeaderInfo& head = static_cast<const STEP::DB&>(*db).GetHeader();

    if(!head.fileSchema.size() || head.fileSchema.substr(0,3) != "IFC") {
        ThrowException("Unrecognized file schema: " + head.fileSchema);
    }

    if (!DefaultLogger::isNullLogger()) {
        LogDebug("File schema is \'" + head.fileSchema + '\'');
        if (head.timestamp.length()) {
            LogDebug("Timestamp \'" + head.timestamp + '\'');
        }
        if (head.app.length()) {
            LogDebug("Application/Exporter identline is \'" + head.app  + '\'');
        }
    }

    // obtain a copy of the machine-generated IFC scheme
    ::Assimp::STEP::EXPRESS::ConversionSchema schema;
    Schema_2x3::GetSchema(schema);

    // tell the reader which entity types to track with special care
    static const char* const types_to_track[] = {
        "ifcsite", "ifcbuilding", "ifcproject"
    };

    // tell the reader for which types we need to simulate STEPs reverse indices
    static const char* const inverse_indices_to_track[] = {
        "ifcrelcontainedinspatialstructure", "ifcrelaggregates", "ifcrelvoidselement", "ifcreldefinesbyproperties", "ifcpropertyset", "ifcstyleditem"
    };

    // feed the IFC schema into the reader and pre-parse all lines
    STEP::ReadFile(*db, schema, types_to_track, inverse_indices_to_track);
    const STEP::LazyObject* proj =  db->GetObject("ifcproject");
    if (!proj) {
        ThrowException("missing IfcProject entity");
    }

    ConversionData conv(*db,proj->To<Schema_2x3::IfcProject>(),pScene,settings);
    SetUnits(conv);
    SetCoordinateSpace(conv);
    ProcessSpatialStructures(conv);
    MakeTreeRelative(conv);

    // NOTE - this is a stress test for the importer, but it works only
    // in a build with no entities disabled. See
    //     scripts/IFCImporter/CPPGenerator.py
    // for more information.
    #ifdef ASSIMP_IFC_TEST
        db->EvaluateAll();
    #endif

    // do final data copying
    if (conv.meshes.size()) {
        pScene->mNumMeshes = static_cast<unsigned int>(conv.meshes.size());
        pScene->mMeshes = new aiMesh*[pScene->mNumMeshes]();
        std::copy(conv.meshes.begin(),conv.meshes.end(),pScene->mMeshes);

        // needed to keep the d'tor from burning us
        conv.meshes.clear();
    }

    if (conv.materials.size()) {
        pScene->mNumMaterials = static_cast<unsigned int>(conv.materials.size());
        pScene->mMaterials = new aiMaterial*[pScene->mNumMaterials]();
        std::copy(conv.materials.begin(),conv.materials.end(),pScene->mMaterials);

        // needed to keep the d'tor from burning us
        conv.materials.clear();
    }

    // apply world coordinate system (which includes the scaling to convert to meters and a -90 degrees rotation around x)
    aiMatrix4x4 scale, rot;
    aiMatrix4x4::Scaling(static_cast<aiVector3D>(IfcVector3(conv.len_scale)),scale);
    aiMatrix4x4::RotationX(-AI_MATH_HALF_PI_F,rot);

    pScene->mRootNode->mTransformation = rot * scale * conv.wcs * pScene->mRootNode->mTransformation;

    // this must be last because objects are evaluated lazily as we process them
    if ( !DefaultLogger::isNullLogger() ){
        LogDebug((Formatter::format(),"STEP: evaluated ",db->GetEvaluatedObjectCount()," object records"));
    }
}